

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

Promise<void> __thiscall kj::joinPromises(kj *this,Array<kj::Promise<void>_> *promises)

{
  size_t count;
  PromiseNode *pPVar1;
  RemoveConst<kj::Own<kj::_::PromiseNode>_> *count_00;
  ArrayJoinPromiseNode<void> *pAVar2;
  Promise<void> *pPVar3;
  PromiseNode *extraout_RDX;
  Promise<void> *pPVar4;
  Promise<void> PVar5;
  ArrayBuilder<kj::Own<kj::_::PromiseNode>_> builder;
  Array<kj::Own<kj::_::PromiseNode>_> result;
  Own<kj::_::ArrayJoinPromiseNode<void>_> local_98;
  ArrayBuilder<kj::Own<kj::_::PromiseNode>_> local_88;
  Array<kj::Own<kj::_::PromiseNode>_> local_60;
  Own<kj::_::PromiseNode> local_48;
  Own<kj::_::PromiseNode> local_38;
  
  count = promises->size_;
  local_88.ptr = _::HeapArrayDisposer::allocateUninitialized<kj::Own<kj::_::PromiseNode>>(count);
  local_88.endPtr = local_88.ptr + count;
  local_88.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pPVar3 = promises->ptr;
  local_88.pos = local_88.ptr;
  for (pPVar4 = pPVar3; pPVar4 != pPVar3 + promises->size_; pPVar4 = pPVar4 + 1) {
    local_48.disposer = (pPVar4->super_PromiseBase).node.disposer;
    pPVar1 = (pPVar4->super_PromiseBase).node.ptr;
    (pPVar4->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
    (local_88.pos)->disposer = local_48.disposer;
    (local_88.pos)->ptr = pPVar1;
    local_48.ptr = (PromiseNode *)0x0;
    local_88.pos = local_88.pos + 1;
    Own<kj::_::PromiseNode>::dispose(&local_48);
    pPVar3 = promises->ptr;
  }
  local_60.size_ = (long)local_88.pos - (long)local_88.ptr >> 4;
  local_60.ptr = local_88.ptr;
  local_60.disposer = local_88.disposer;
  local_88.ptr = (Own<kj::_::PromiseNode> *)0x0;
  local_88.pos = (RemoveConst<kj::Own<kj::_::PromiseNode>_> *)0x0;
  local_88.endPtr = (Own<kj::_::PromiseNode> *)0x0;
  ArrayBuilder<kj::Own<kj::_::PromiseNode>_>::dispose(&local_88);
  count_00 = (RemoveConst<kj::Own<kj::_::PromiseNode>_> *)promises->size_;
  local_88.ptr = (Own<kj::_::PromiseNode> *)
                 _::HeapArrayDisposer::allocate<kj::_::ExceptionOr<kj::_::Void>>((size_t)count_00);
  local_88.endPtr = (Own<kj::_::PromiseNode> *)&_::HeapArrayDisposer::instance;
  local_88.pos = count_00;
  heap<kj::_::ArrayJoinPromiseNode<void>,kj::Array<kj::Own<kj::_::PromiseNode>>,kj::Array<kj::_::ExceptionOr<kj::_::Void>>>
            ((kj *)&local_98,&local_60,(Array<kj::_::ExceptionOr<kj::_::Void>_> *)&local_88);
  pAVar2 = local_98.ptr;
  local_38.disposer = local_98.disposer;
  local_98.ptr = (ArrayJoinPromiseNode<void> *)0x0;
  *(Disposer **)this = local_98.disposer;
  *(ArrayJoinPromiseNode<void> **)(this + 8) = pAVar2;
  local_38.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_38);
  Own<kj::_::ArrayJoinPromiseNode<void>_>::dispose(&local_98);
  Array<kj::_::ExceptionOr<kj::_::Void>_>::~Array
            ((Array<kj::_::ExceptionOr<kj::_::Void>_> *)&local_88);
  Array<kj::Own<kj::_::PromiseNode>_>::~Array(&local_60);
  PVar5.super_PromiseBase.node.ptr = extraout_RDX;
  PVar5.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar5.super_PromiseBase.node;
}

Assistant:

Promise<void> joinPromises(Array<Promise<void>>&& promises) {
  return Promise<void>(false, kj::heap<_::ArrayJoinPromiseNode<void>>(
      KJ_MAP(p, promises) { return kj::mv(p.node); },
      heapArray<_::ExceptionOr<_::Void>>(promises.size())));
}